

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O0

void monster_group_free(chunk *c,monster_group_conflict *group)

{
  mon_group_list_entry_conflict *pmVar1;
  mon_group_list_entry_conflict *next;
  monster_group_conflict *group_local;
  chunk *c_local;
  
  while (group->member_list != (mon_group_list_entry_conflict *)0x0) {
    pmVar1 = group->member_list->next;
    mem_free(group->member_list);
    group->member_list = pmVar1;
  }
  mem_free(group);
  return;
}

Assistant:

void monster_group_free(struct chunk *c, struct monster_group *group)
{
	/* Free the member list */
	while (group->member_list) {
		struct mon_group_list_entry *next = group->member_list->next;
		mem_free(group->member_list);
		group->member_list = next;
	}

	mem_free(group);
}